

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall cmMakefile::GetDef(cmMakefile *this,string *name)

{
  bool bVar1;
  cmState *pcVar2;
  cmVariableWatch *this_00;
  char *local_58;
  bool watch_function_executed;
  cmVariableWatch *vv;
  string *def;
  string *name_local;
  cmMakefile *this_local;
  
  vv = (cmVariableWatch *)cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  if ((string *)vv == (string *)0x0) {
    pcVar2 = GetState(this);
    vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(pcVar2,name);
  }
  this_00 = GetVariableWatch(this);
  if ((this_00 != (cmVariableWatch *)0x0) && ((this->SuppressSideEffects & 1U) == 0)) {
    if (vv == (cmVariableWatch *)0x0) {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = (char *)std::__cxx11::string::c_str();
    }
    bVar1 = cmVariableWatch::VariableAccessed
                      (this_00,name,(uint)(vv == (cmVariableWatch *)0x0),local_58,this);
    if ((bVar1) &&
       (vv = (cmVariableWatch *)cmStateSnapshot::GetDefinition(&this->StateSnapshot,name),
       (string *)vv == (string *)0x0)) {
      pcVar2 = GetState(this);
      vv = (cmVariableWatch *)cmState::GetInitializedCacheValue(pcVar2,name);
    }
  }
  return (string *)vv;
}

Assistant:

const std::string* cmMakefile::GetDef(const std::string& name) const
{
  const std::string* def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv && !this->SuppressSideEffects) {
    bool const watch_function_executed =
      vv->VariableAccessed(name,
                           def ? cmVariableWatch::VARIABLE_READ_ACCESS
                               : cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS,
                           (def ? def->c_str() : nullptr), this);

    if (watch_function_executed) {
      // A callback was executed and may have caused re-allocation of the
      // variable storage.  Look it up again for now.
      // FIXME: Refactor variable storage to avoid this problem.
      def = this->StateSnapshot.GetDefinition(name);
      if (!def) {
        def = this->GetState()->GetInitializedCacheValue(name);
      }
    }
  }
#endif
  return def;
}